

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

PatternSyntax * __thiscall slang::parsing::Parser::parsePattern(Parser *this)

{
  Token closeBrace_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token openBrace_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  PatternSyntax *pattern_00;
  undefined4 extraout_var;
  ExpressionSyntax *expr;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX_01;
  Token TVar4;
  Token TVar5;
  Token TVar6;
  bitmask<slang::parsing::detail::ExpressionOptions> local_23c;
  char local_238 [16];
  pointer local_228;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> local_218;
  Info *local_1e8;
  Info *pIStack_1e0;
  anon_class_8_1_8991fb9c local_1d0;
  undefined4 local_1c4;
  anon_class_8_1_8991fb9c local_1c0;
  undefined4 local_1b4;
  Token local_1b0;
  undefined1 local_190 [8];
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  Token closeBrace;
  Token openBrace;
  TokenKind local_d8;
  PatternSyntax *local_c8;
  PatternSyntax *pattern_1;
  Token name;
  Token tagged;
  Token dot;
  PatternSyntax *pattern;
  Token openParen;
  Parser *this_local;
  
  TVar4 = ParserBase::peek(&this->super_ParserBase);
  openParen.info._0_2_ = TVar4.kind;
  if ((TokenKind)openParen.info == ApostropheOpenBrace) {
    TVar4 = ParserBase::consume(&this->super_ParserBase);
    Token::Token((Token *)(buffer.stackBase + 0x40));
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)local_190);
    bVar2 = ParserBase::peek(&this->super_ParserBase,Identifier);
    bVar1 = false;
    if (bVar2) {
      local_1b0 = ParserBase::peek(&this->super_ParserBase,1);
      bVar1 = local_1b0.kind == Colon;
    }
    if (bVar1) {
      local_1b4 = 0x3d0005;
      local_1c0.this = this;
      ParserBase::
      parseList<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isCloseBrace,slang::parsing::Parser::parsePattern()::__0>
                (&this->super_ParserBase,(SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_190,
                 CloseBrace,Comma,(Token *)(buffer.stackBase + 0x40),True,(DiagCode)0x3d0005,
                 &local_1c0,False);
      src = extraout_RDX;
    }
    else {
      local_1c4 = 0x3d0005;
      local_1d0.this = this;
      ParserBase::
      parseList<&slang::syntax::SyntaxFacts::isPossiblePatternOrComma,&slang::syntax::SyntaxFacts::isCloseBrace,slang::parsing::Parser::parsePattern()::__1>
                (&this->super_ParserBase,(SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_190,
                 CloseBrace,Comma,(Token *)(buffer.stackBase + 0x40),True,(DiagCode)0x3d0005,
                 &local_1d0,False);
      src = extraout_RDX_00;
    }
    closeBrace.info = TVar4._0_8_;
    openBrace._0_8_ = TVar4.info;
    local_1e8 = closeBrace.info;
    pIStack_1e0 = (Info *)openBrace._0_8_;
    iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_190,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
    local_228 = (pointer)CONCAT44(extraout_var,iVar3);
    elements.size_ = extraout_RDX_01;
    elements.data_ = local_228;
    slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::
    SeparatedSyntaxList(&local_218,elements);
    local_238[0] = buffer.stackBase[0x40];
    local_238[1] = buffer.stackBase[0x41];
    local_238[2] = buffer.stackBase[0x42];
    local_238[3] = buffer.stackBase[0x43];
    local_238[4] = buffer.stackBase[0x44];
    local_238[5] = buffer.stackBase[0x45];
    local_238[6] = buffer.stackBase[0x46];
    local_238[7] = buffer.stackBase[0x47];
    openBrace_00.info = pIStack_1e0;
    openBrace_00._0_8_ = local_1e8;
    closeBrace_00.info = (Info *)closeBrace._0_8_;
    closeBrace_00._0_8_ = buffer.stackBase._64_8_;
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::structurePattern
                           (&this->factory,openBrace_00,&local_218,closeBrace_00);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)local_190);
  }
  else if ((TokenKind)openParen.info == OpenParenthesis) {
    TVar4 = ParserBase::consume(&this->super_ParserBase);
    pattern_00 = parsePattern(this);
    TVar5 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::parenthesizedPattern
                           (&this->factory,TVar4,pattern_00,TVar5);
  }
  else if ((TokenKind)openParen.info == DotStar) {
    TVar4 = ParserBase::consume(&this->super_ParserBase);
    this_local = (Parser *)slang::syntax::SyntaxFactory::wildcardPattern(&this->factory,TVar4);
  }
  else if ((TokenKind)openParen.info == Dot) {
    TVar4 = ParserBase::consume(&this->super_ParserBase);
    TVar5 = ParserBase::expect(&this->super_ParserBase,Identifier);
    this_local = (Parser *)slang::syntax::SyntaxFactory::variablePattern(&this->factory,TVar4,TVar5)
    ;
  }
  else if ((TokenKind)openParen.info == TaggedKeyword) {
    TVar4 = ParserBase::consume(&this->super_ParserBase);
    TVar5 = ParserBase::expect(&this->super_ParserBase,Identifier);
    local_c8 = (PatternSyntax *)0x0;
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    local_d8 = TVar6.kind;
    bVar1 = slang::syntax::SyntaxFacts::isPossiblePattern(local_d8);
    if (bVar1) {
      local_c8 = parsePattern(this);
    }
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::taggedPattern(&this->factory,TVar4,TVar5,local_c8);
  }
  else {
    bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_23c,PatternContext);
    expr = parseSubExpression(this,local_23c,0);
    this_local = (Parser *)slang::syntax::SyntaxFactory::expressionPattern(&this->factory,expr);
  }
  return (PatternSyntax *)this_local;
}

Assistant:

PatternSyntax& Parser::parsePattern() {
    switch (peek().kind) {
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& pattern = parsePattern();
            return factory.parenthesizedPattern(openParen, pattern,
                                                expect(TokenKind::CloseParenthesis));
        }
        case TokenKind::DotStar:
            return factory.wildcardPattern(consume());
        case TokenKind::Dot: {
            auto dot = consume();
            return factory.variablePattern(dot, expect(TokenKind::Identifier));
        }
        case TokenKind::TaggedKeyword: {
            auto tagged = consume();
            auto name = expect(TokenKind::Identifier);

            PatternSyntax* pattern = nullptr;
            if (isPossiblePattern(peek().kind))
                pattern = &parsePattern();

            return factory.taggedPattern(tagged, name, pattern);
        }
        case TokenKind::ApostropheOpenBrace: {
            auto openBrace = consume();
            Token closeBrace;
            SmallVector<TokenOrSyntax, 4> buffer;

            if (peek(TokenKind::Identifier) && peek(1).kind == TokenKind::Colon) {
                parseList<isIdentifierOrComma, isCloseBrace>(
                    buffer, TokenKind::CloseBrace, TokenKind::Comma, closeBrace, RequireItems::True,
                    diag::ExpectedPattern, [this]() { return &parseMemberPattern(); });
            }
            else {
                parseList<isPossiblePatternOrComma, isCloseBrace>(
                    buffer, TokenKind::CloseBrace, TokenKind::Comma, closeBrace, RequireItems::True,
                    diag::ExpectedPattern, [this]() {
                        auto& pattern = parsePattern();
                        return &factory.orderedStructurePatternMember(pattern);
                    });
            }

            return factory.structurePattern(openBrace, buffer.copy(alloc), closeBrace);
        }
        default:
            break;
    }

    // otherwise, it's either an expression or an error (parseExpression will handle that for us)
    return factory.expressionPattern(parseSubExpression(ExpressionOptions::PatternContext, 0));
}